

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::readToken(Token *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  string local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  Token local_128;
  Token local_f8;
  Token local_c8;
  Token local_98;
  Token local_68;
  char local_25;
  int local_24;
  int iStack_20;
  char c;
  int colNo;
  int lineNo;
  Lexer *this_local;
  Token *token;
  
  _lineNo = this;
  this_local = (Lexer *)__return_storage_ptr__;
  skipWhitespace(this);
  colNo._3_1_ = 0;
  Token::Token(__return_storage_ptr__,NullToken);
  iStack_20 = this->_currentLineNo + 1;
  local_24 = this->_currentColumnNo + 1;
  local_25 = peekChar(this);
  iVar1 = isalpha((int)local_25);
  if (((iVar1 == 0) && (local_25 != '.')) && (local_25 != '_')) {
    iVar1 = isdigit((int)local_25);
    if ((iVar1 == 0) && (local_25 != '-')) {
      switch(local_25) {
      case '\0':
        readLineTerminator(&local_f8,this);
        Token::operator=(__return_storage_ptr__,&local_f8);
        Token::~Token(&local_f8);
        break;
      default:
        std::__cxx11::string::string(local_1a8);
        std::operator+(local_188,(char *)local_1a8);
        std::operator+(local_168,(char)local_188);
        std::operator+(local_148,(char *)local_168);
        lexerError(this,local_148);
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::~string((string *)local_188);
        std::__cxx11::string::~string(local_1a8);
        break;
      case '#':
      case '(':
      case ')':
      case ',':
      case ':':
        readDelimiter(&local_128,this);
        Token::operator=(__return_storage_ptr__,&local_128);
        Token::~Token(&local_128);
        break;
      case '@':
        readRegister(&local_c8,this);
        Token::operator=(__return_storage_ptr__,&local_c8);
        Token::~Token(&local_c8);
      }
    }
    else {
      readNumber(&local_98,this);
      Token::operator=(__return_storage_ptr__,&local_98);
      Token::~Token(&local_98);
    }
  }
  else {
    readKeywordOrIdentifier(&local_68,this);
    Token::operator=(__return_storage_ptr__,&local_68);
    Token::~Token(&local_68);
  }
  __return_storage_ptr__->lineNumber = iStack_20;
  __return_storage_ptr__->columnNumber = local_24;
  skipWhitespace(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::readToken() {
    skipWhitespace();

    Token token{Token::NullToken};

    int lineNo = _currentLineNo + 1;
    int colNo = _currentColumnNo + 1;

    char c = peekChar();

    if(std::isalpha(c) || c == '.' || c == '_') {
        token = readKeywordOrIdentifier();
    } else if(std::isdigit(c) || c == '-') {
        token = readNumber();
    } else {
        switch(c) {
//            case '.':
//                token = readKeyword();
//                break;
            case '@':
                token = readRegister();
                break;
            case '\0':
                token = readLineTerminator();
                break;
            case ',':
            case '(':
            case ')':
            case ':':
            case '#':
                token = readDelimiter();
                break;
            default:
                lexerError(std::string{} + "unexpected character: '" + c + "'");
        }
    }

    token.lineNumber = lineNo;
    token.columnNumber = colNo;

    skipWhitespace();

    return token;
}